

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall Application::fail(Application *this)

{
  Log *pLVar1;
  Member *pMVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Params *pPVar6;
  long lVar7;
  
  pPVar6 = this->par;
  if (pPVar6->DROP_MSG != 0) {
    iVar3 = Params::getcurrtime(pPVar6);
    pPVar6 = this->par;
    if (iVar3 == 0x32) {
      pPVar6->dropmsg = 1;
    }
  }
  if (pPVar6->SINGLE_FAILURE != 0) {
    iVar3 = Params::getcurrtime(pPVar6);
    if (iVar3 == 100) {
      iVar3 = rand();
      iVar3 = iVar3 % this->par->EN_GPSZ;
      pLVar1 = this->log;
      pMVar2 = this->mp1[iVar3]->memberNode;
      uVar4 = Params::getcurrtime(this->par);
      Log::LOG(pLVar1,&pMVar2->addr,"Node failed at time=%d",(ulong)uVar4);
      this->mp1[iVar3]->memberNode->bFailed = true;
      goto LAB_00102bd8;
    }
    pPVar6 = this->par;
  }
  iVar3 = Params::getcurrtime(pPVar6);
  if (iVar3 == 100) {
    iVar5 = rand();
    pPVar6 = this->par;
    iVar3 = pPVar6->EN_GPSZ;
    iVar5 = (int)((long)((ulong)(uint)((int)((long)iVar5 % (long)iVar3) >> 0x1f) << 0x20 |
                        (long)iVar5 % (long)iVar3 & 0xffffffffU) / 2);
    for (lVar7 = (long)iVar5; lVar7 < iVar3 / 2 + iVar5; lVar7 = lVar7 + 1) {
      pLVar1 = this->log;
      pMVar2 = this->mp1[lVar7]->memberNode;
      uVar4 = Params::getcurrtime(pPVar6);
      Log::LOG(pLVar1,&pMVar2->addr,"Node failed at time = %d",(ulong)uVar4);
      this->mp1[lVar7]->memberNode->bFailed = true;
      pPVar6 = this->par;
      iVar3 = pPVar6->EN_GPSZ;
    }
  }
LAB_00102bd8:
  if (this->par->DROP_MSG != 0) {
    iVar3 = Params::getcurrtime(this->par);
    if (iVar3 == 300) {
      this->par->dropmsg = 0;
    }
  }
  return;
}

Assistant:

void Application::fail() {
	int i, removed;

	// fail half the members at time t=400
	if( par->DROP_MSG && par->getcurrtime() == 50 ) {
		par->dropmsg = 1;
	}

	if( par->SINGLE_FAILURE && par->getcurrtime() == 100 ) {
		removed = (rand() % par->EN_GPSZ);
		#ifdef DEBUGLOG
		log->LOG(&mp1[removed]->getMemberNode()->addr, "Node failed at time=%d", par->getcurrtime());
		#endif
		mp1[removed]->getMemberNode()->bFailed = true;
	}
	else if( par->getcurrtime() == 100 ) {
		removed = rand() % par->EN_GPSZ/2;
		for ( i = removed; i < removed + par->EN_GPSZ/2; i++ ) {
			#ifdef DEBUGLOG
			log->LOG(&mp1[i]->getMemberNode()->addr, "Node failed at time = %d", par->getcurrtime());
			#endif
			mp1[i]->getMemberNode()->bFailed = true;
		}
	}

	if( par->DROP_MSG && par->getcurrtime() == 300) {
		par->dropmsg=0;
	}

}